

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O3

R_conflict21 __thiscall QBitArray::bitLocation<QBitArray>(QBitArray *this,QBitArray *ba,qsizetype i)

{
  Data *pDVar1;
  qsizetype extraout_RDX;
  R_conflict21 RVar2;
  
  pDVar1 = (this->d).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
    QByteArray::reallocData(&this->d,(this->d).d.size,KeepSize);
    i = extraout_RDX;
  }
  RVar2._9_7_ = (undefined7)((ulong)i >> 8);
  RVar2.bitMask = '\x01' << ((byte)ba & 7);
  RVar2.byte = (this->d).d.ptr + ((long)ba >> 3) + 1;
  return RVar2;
}

Assistant:

static auto bitLocation(BitArray &ba, qsizetype i)
    {
        Q_ASSERT(size_t(i) < size_t(ba.size()));
        struct R {
            decltype(ba.d[1]) byte;
            uchar bitMask;
        };
        qsizetype byteIdx = i >> 3;
        qsizetype bitIdx = i & 7;
        return R{ ba.d[1 + byteIdx], uchar(1U << bitIdx) };
    }